

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

void __thiscall QPDFMatrix::translate(QPDFMatrix *this,double tx,double ty)

{
  QPDFMatrix local_30;
  
  local_30.a = 1.0;
  local_30.b = 0.0;
  local_30.c = 0.0;
  local_30.d = 1.0;
  local_30.e = tx;
  local_30.f = ty;
  concat(this,&local_30);
  return;
}

Assistant:

void
QPDFMatrix::translate(double tx, double ty)
{
    concat(QPDFMatrix(1, 0, 0, 1, tx, ty));
}